

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O2

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::front(tsqueue<blcl::net::message<MsgType>_> *this)

{
  message<MsgType> *pmVar1;
  
  std::mutex::lock(&this->queue_mtx_);
  pmVar1 = (this->raw_deque_).
           super__Deque_base<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
  return pmVar1;
}

Assistant:

const T& front() {
            std::scoped_lock lock(queue_mtx_);
            return raw_deque_.front();
        }